

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin
          (int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  long in_RDI;
  string_view sVar4;
  format_specs in_stack_00000000;
  int num_digits;
  undefined1 local_48 [28];
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  bin_writer<1> f;
  size_t sVar5;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x14 + (ulong)uVar2) = 0x30;
    uVar1 = *(undefined1 *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x14 + (ulong)uVar2) = uVar1;
  }
  iVar3 = count_digits<1u,unsigned_int>(*(uint *)(in_RDI + 0x10));
  sVar4 = get_prefix((int_writer<unsigned_int,_fmt::v6::basic_format_specs<wchar_t>_> *)0x269aca);
  f = (bin_writer<1>)sVar4.data_;
  sVar5 = sVar4.size_;
  memcpy(local_48,*(void **)(in_RDI + 8),0x24);
  sVar4.size_._0_4_ = in_stack_fffffffffffffff0;
  sVar4.data_ = (char *)sVar5;
  sVar4.size_._4_4_ = iVar3;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4
             ,sVar4,in_stack_00000000,f);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }